

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall ddd::DaTrie<true,_false,_true>::push_block_(DaTrie<true,_false,_true> *this)

{
  pointer *ppBVar1;
  pointer *ppBVar2;
  ulong uVar3;
  iterator __position;
  iterator __position_00;
  pointer pBVar4;
  ulong uVar5;
  int iVar6;
  uint32_t block_pos;
  ulong uVar7;
  BlockLink local_38;
  
  uVar7 = (ulong)((long)(this->blocks_).
                        super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->blocks_).
                       super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 4;
  iVar6 = 0x100;
  do {
    local_38.next = 0;
    local_38.prev = 0;
    __position._M_current =
         (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::_M_realloc_insert<ddd::Bc>
                (&this->bc_,__position,(Bc *)&local_38);
    }
    else {
      *__position._M_current = (Bc)0x0;
      ppBVar1 = &(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  local_38.head = 0;
  local_38.num_emps = 0x100;
  local_38.next = 0;
  local_38.prev = 0;
  __position_00._M_current =
       (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::_M_realloc_insert<ddd::BlockLink>
              (&this->blocks_,__position_00,&local_38);
  }
  else {
    (__position_00._M_current)->next = 0;
    (__position_00._M_current)->prev = 0;
    (__position_00._M_current)->head = 0;
    (__position_00._M_current)->num_emps = 0x100;
    ppBVar2 = &(this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppBVar2 = *ppBVar2 + 1;
  }
  block_pos = (uint32_t)uVar7;
  if (block_pos * 0x100 != -0x100) {
    uVar5 = (uVar7 << 0x28) + 0x7fffffff00000000;
    uVar7 = (ulong)(block_pos << 8);
    do {
      uVar3 = uVar7 + 1;
      *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start + uVar7) = (uint)uVar3 & 0x7fffffff;
      pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar4[uVar7] = (Bc)((ulong)pBVar4[uVar7] & 0x80000000ffffffff | uVar5 & 0x7fffffff00000000);
      uVar5 = uVar5 + 0x100000000;
      uVar7 = uVar3;
    } while (uVar3 < block_pos * 0x100 + 0x100);
  }
  push_block_(this,block_pos,&this->blocks_);
  this->bc_emps_ = this->bc_emps_ + 0x100;
  return;
}

Assistant:

void push_block_() {
    auto block_pos = num_blocks();

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.push_back(Bc{});
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.push_back(NodeLink{});
      }
    }
    blocks_.push_back(BlockType{});

    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto i = begin; i < end; ++i) {
      set_next_(i, i + 1);
      set_prev_(i, i - 1);
    }

    push_block_(block_pos, blocks_);
    bc_emps_ += BLOCK_SIZE;
  }